

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v8::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char cVar1;
  bool bVar2;
  type tVar3;
  size_t sVar4;
  size_t sVar5;
  char *__src;
  char *pcVar6;
  buffer<char> *in_RDX;
  ulong in_RSI;
  uint in_EDI;
  undefined8 in_XMM0_Qa;
  char *fraction_end;
  int fraction_size;
  char *p;
  int exp;
  char sign;
  char *exp_pos;
  char *end;
  int fraction_size_1;
  char *p_1;
  char *end_1;
  anon_class_1_0_00000001 is_digit;
  type size;
  int result;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  size_t capacity;
  char *begin;
  size_t offset;
  char *format_ptr;
  char format [7];
  size_t in_stack_fffffffffffffef8;
  buffer<char> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  buffer<char> *in_stack_ffffffffffffff10;
  bool local_e1;
  int local_c8;
  char local_c0;
  char local_bf;
  char local_bd;
  uint local_bc;
  char *local_b0;
  int local_a8;
  bool local_a1;
  char *local_a0;
  int local_98;
  bool local_92;
  char local_91;
  char *local_90;
  char *local_88;
  int local_7c;
  char *local_78;
  char *local_70;
  anon_class_1_0_00000001 local_61;
  type local_60;
  int local_5c;
  code *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  char local_30 [7];
  bool local_29;
  buffer<char> *local_28;
  uint local_1c;
  undefined8 local_18;
  undefined8 local_c;
  int local_4;
  
  local_28 = in_RDX;
  local_1c = in_EDI;
  local_18 = in_XMM0_Qa;
  local_c = in_RSI;
  sVar4 = buffer<char>::capacity(in_RDX);
  sVar5 = buffer<char>::size(local_28);
  local_29 = sVar5 < sVar4;
  ignore_unused<bool,char[13]>(&local_29,(char (*) [13])"empty buffer");
  cVar1 = (char)(local_c >> 0x20);
  if ((cVar1 == '\0') || (cVar1 == '\x01')) {
    if ((int)local_1c < 0) {
      local_bc = 6;
    }
    else {
      local_bc = local_1c;
    }
    local_1c = local_bc - 1;
  }
  local_38 = local_30 + 1;
  local_30[0] = '%';
  if (((local_c._4_4_ >> 0x14 & 1) != 0) && (cVar1 == '\x03')) {
    local_38 = local_30 + 2;
    local_30[1] = 0x23;
  }
  if (-1 < (int)local_1c) {
    pcVar6 = local_38 + 1;
    *local_38 = '.';
    local_38 = local_38 + 2;
    *pcVar6 = '*';
  }
  if (cVar1 == '\x03') {
    local_c0 = 'A';
    if ((local_c & 0x1000000000000) == 0) {
      local_c0 = 'a';
    }
    local_bf = local_c0;
  }
  else {
    local_bd = 'f';
    if (cVar1 != '\x02') {
      local_bd = 'e';
    }
    local_bf = local_bd;
  }
  *local_38 = local_bf;
  local_38[1] = '\0';
  local_38 = local_38 + 1;
  local_40 = buffer<char>::size(local_28);
  while( true ) {
    while( true ) {
      local_48 = buffer<char>::data(local_28);
      local_48 = local_48 + local_40;
      sVar4 = buffer<char>::capacity(local_28);
      local_50 = sVar4 - local_40;
      local_58 = snprintf;
      if ((int)local_1c < 0) {
        local_c8 = snprintf(local_48,local_50,local_30,local_18,snprintf);
      }
      else {
        local_c8 = snprintf(local_48,local_50,local_30,local_18,(ulong)local_1c,snprintf);
      }
      local_5c = local_c8;
      if (-1 < local_c8) break;
      buffer<char>::capacity(local_28);
      buffer<char>::try_reserve(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    local_60 = to_unsigned<int>(0);
    if (local_60 < local_50) break;
    buffer<char>::try_reserve(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  cVar1 = (char)(local_c >> 0x20);
  if (cVar1 == '\x02') {
    if (local_1c == 0) {
      buffer<char>::try_resize(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
      local_4 = 0;
    }
    else {
      local_78 = local_48 + local_60;
      local_70 = local_78;
      do {
        local_78 = local_78 + -1;
        bVar2 = snprintf_float<double>::anon_class_1_0_00000001::operator()(&local_61,*local_78);
        pcVar6 = local_78;
      } while (bVar2);
      local_7c = ((int)local_70 - (int)local_78) + -1;
      __src = local_78 + 1;
      tVar3 = to_unsigned<int>(0);
      memmove(pcVar6,__src,(ulong)tVar3);
      buffer<char>::try_resize(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
      local_4 = -local_7c;
    }
  }
  else if (cVar1 == '\x03') {
    buffer<char>::try_resize(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    local_4 = 0;
  }
  else {
    local_88 = local_48 + local_60;
    pcVar6 = local_88;
    do {
      local_90 = pcVar6;
      pcVar6 = local_90 + -1;
    } while (*pcVar6 != 'e');
    local_91 = *local_90;
    local_e1 = local_91 == '+' || local_91 == '-';
    local_92 = local_e1;
    local_90 = pcVar6;
    ignore_unused<bool,char[1]>(&local_92,(char (*) [1])0x1c61ba);
    local_98 = 0;
    local_a0 = local_90 + 2;
    do {
      local_a1 = snprintf_float<double>::anon_class_1_0_00000001::operator()(&local_61,*local_a0);
      ignore_unused<bool,char[1]>(&local_a1,(char (*) [1])0x1c61ba);
      pcVar6 = local_a0 + 1;
      local_98 = local_98 * 10 + *local_a0 + -0x30;
      local_a0 = pcVar6;
    } while (pcVar6 != local_88);
    if (local_91 == '-') {
      local_98 = -local_98;
    }
    local_a8 = 0;
    local_b0 = local_90;
    if (local_90 != local_48 + 1) {
      do {
        local_b0 = local_b0 + -1;
      } while (*local_b0 == '0');
      local_a8 = ((int)local_b0 - (int)local_48) + -1;
      in_stack_ffffffffffffff08 = local_48 + 1;
      in_stack_ffffffffffffff10 = (buffer<char> *)(local_48 + 2);
      tVar3 = to_unsigned<int>(0);
      memmove(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,(ulong)tVar3);
    }
    to_unsigned<int>(0);
    buffer<char>::try_resize(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    local_4 = local_98 - local_a8;
  }
  return local_4;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    FMT_ASSERT(sign == '+' || sign == '-', "");
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      FMT_ASSERT(is_digit(*p), "");
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}